

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void MultiplicationHelper<signed_char,_long,_14>::
     MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(char t,long *u,char *ret)

{
  int32_t *in_RSI;
  undefined1 in_DIL;
  int32_t tmp;
  int64_t u1;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  int u_00;
  undefined7 in_stack_fffffffffffffff8;
  
  u_00 = (int)((ulong)*(undefined8 *)in_RSI >> 0x20);
  uVar1 = 0;
  LargeIntRegMultiply<int,_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (tmp,(int64_t *)CONCAT17(in_DIL,in_stack_fffffffffffffff8),in_RSI);
  SafeCastHelper<signed_char,_int,_4>::
  CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (u_00,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void MultiplyThrow(T t, const U& u, T& ret) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<U>::isInt64, "U must be Int64");
        std::int64_t u1 = u;
        std::int32_t tmp = 0;

        LargeIntRegMultiply< std::int32_t, std::int64_t >::template RegMultiplyThrow< E >( (std::int32_t)t, u1, &tmp );
        SafeCastHelper< T, std::int32_t, GetCastMethod< T, std::int32_t >::method >::template CastThrow< E >( tmp, ret );
    }